

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O0

void __thiscall QOpenGLWindow::metric(QOpenGLWindow *this)

{
  PaintDeviceMetric in_stack_00000014;
  QOpenGLWindow *in_stack_00000018;
  
  metric(in_stack_00000018,in_stack_00000014);
  return;
}

Assistant:

int QOpenGLWindow::metric(PaintDeviceMetric metric) const
{
    Q_D(const QOpenGLWindow);

    switch (metric) {
        case PdmDepth:
            if (d->paintDevice)
                return d->paintDevice->depth();
            break;
        default:
            break;
    }
    return QPaintDeviceWindow::metric(metric);
}